

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O3

int __thiscall
anon_unknown.dwarf_38a::NinjaMain::ToolRecompact
          (NinjaMain *this,Options *options,int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = EnsureBuildDirExists(this);
  uVar2 = 1;
  if (bVar1) {
    bVar1 = OpenBuildLog(this,true);
    if (bVar1) {
      bVar1 = OpenDepsLog(this,true);
      uVar2 = (uint)!bVar1;
    }
  }
  return uVar2;
}

Assistant:

int NinjaMain::ToolRecompact(const Options* options, int argc, char* argv[]) {
  if (!EnsureBuildDirExists())
    return 1;

  if (OpenBuildLog(/*recompact_only=*/true) == LOAD_ERROR ||
      OpenDepsLog(/*recompact_only=*/true) == LOAD_ERROR)
    return 1;

  return 0;
}